

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

bool __thiscall ON_SubDMeshFragment::HasValidPointAndNormalGrid(ON_SubDMeshFragment *this)

{
  bool local_11;
  ON_SubDMeshFragment *this_local;
  
  local_11 = false;
  if ((((this->m_P != (double *)0x0) && (local_11 = false, 2 < this->m_P_stride)) &&
      (local_11 = false, this->m_N != (double *)0x0)) &&
     (((this->m_N_stride == 0 || (local_11 = false, 2 < this->m_N_stride)) &&
      (local_11 = false, (this->m_grid).m_side_segment_count != '\0')))) {
    local_11 = (this->m_grid).m_S != (uint *)0x0;
  }
  return local_11;
}

Assistant:

const bool ON_SubDMeshFragment::HasValidPointAndNormalGrid() const
{
  return
    nullptr != m_P
    && m_P_stride >= 3
    && nullptr != m_N
    && ( 0 == m_N_stride || m_N_stride >= 3)
    && m_grid.m_side_segment_count > 0
    && nullptr != m_grid.m_S
    ;
}